

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt0.c
# Opt level: O2

HCOSE_ENCRYPT COSE_Encrypt_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  COSE_Encrypt *p;
  
  if (flags == COSE_INIT_FLAGS_NONE) {
    p = (COSE_Encrypt *)calloc(1,0x70);
    if (p == (COSE_Encrypt *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
    }
    else {
      _Var1 = _COSE_Init(COSE_INIT_FLAGS_NONE,(COSE *)p,0x60,perr);
      if (_Var1) {
        _COSE_InsertInList(&EncryptRoot,(COSE *)p);
        return (HCOSE_ENCRYPT)p;
      }
      _COSE_Encrypt_Release(p);
      free(p);
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  return (HCOSE_ENCRYPT)0x0;
}

Assistant:

HCOSE_ENCRYPT COSE_Encrypt_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	CHECK_CONDITION(flags == COSE_INIT_FLAGS_NONE, COSE_ERR_INVALID_PARAMETER);
	COSE_Encrypt * pobj = (COSE_Encrypt *)COSE_CALLOC(1, sizeof(COSE_Encrypt), context);
	CHECK_CONDITION(pobj != NULL, COSE_ERR_OUT_OF_MEMORY);

	if (!_COSE_Init(flags, &pobj->m_message, COSE_enveloped_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		_COSE_Encrypt_Release(pobj);
		COSE_FREE(pobj, context);
		return NULL;
	}

	_COSE_InsertInList(&EncryptRoot, &pobj->m_message);

	return (HCOSE_ENCRYPT) pobj;

errorReturn:
	return NULL;
}